

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group.cpp
# Opt level: O0

void __thiscall duckdb::VersionDeleteState::Delete(VersionDeleteState *this,row_t row_id)

{
  long lVar1;
  unsigned_long uVar2;
  ulong uVar3;
  long lVar4;
  long in_RSI;
  long in_RDI;
  VersionDeleteState *unaff_retaddr;
  idx_t idx_in_vector;
  idx_t vector_idx;
  
  uVar2 = UnsafeNumericCast<unsigned_long,long,void>(in_RSI);
  uVar3 = uVar2 >> 0xb;
  uVar2 = UnsafeNumericCast<unsigned_long,long,void>(in_RSI);
  if (*(ulong *)(in_RDI + 0x28) != uVar3) {
    Flush(unaff_retaddr);
    *(ulong *)(in_RDI + 0x28) = uVar3;
    *(ulong *)(in_RDI + 0x4040) = uVar3 << 0xb;
  }
  lVar4 = UnsafeNumericCast<long,unsigned_long,void>(uVar2 + uVar3 * -0x800);
  lVar1 = *(long *)(in_RDI + 0x4030);
  *(long *)(in_RDI + 0x4030) = lVar1 + 1;
  *(long *)(in_RDI + 0x30 + lVar1 * 8) = lVar4;
  return;
}

Assistant:

void VersionDeleteState::Delete(row_t row_id) {
	D_ASSERT(row_id >= 0);
	idx_t vector_idx = UnsafeNumericCast<idx_t>(row_id) / STANDARD_VECTOR_SIZE;
	idx_t idx_in_vector = UnsafeNumericCast<idx_t>(row_id) - vector_idx * STANDARD_VECTOR_SIZE;
	if (current_chunk != vector_idx) {
		Flush();

		current_chunk = vector_idx;
		chunk_row = vector_idx * STANDARD_VECTOR_SIZE;
	}
	rows[count++] = UnsafeNumericCast<row_t>(idx_in_vector);
}